

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int __thiscall smf::MidiEventList::markSequence(MidiEventList *this,int sequence)

{
  int iVar1;
  MidiEvent *pMVar2;
  int local_18;
  int local_14;
  int i;
  int sequence_local;
  MidiEventList *this_local;
  
  local_18 = 0;
  local_14 = sequence;
  while( true ) {
    iVar1 = getEventCount(this);
    if (iVar1 <= local_18) break;
    pMVar2 = getEvent(this,local_18);
    pMVar2->seq = local_14;
    local_18 = local_18 + 1;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int MidiEventList::markSequence(int sequence) {
	for (int i=0; i<getEventCount(); i++) {
		getEvent(i).seq = sequence++;
	}
	return sequence;
}